

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O1

int WallMost(short *mostbuf,secplane_t *plane,FWallCoords *wallc)

{
  short sVar1;
  int iVar2;
  SWORD *b2_1;
  vertex_t *pvVar3;
  int iVar4;
  SWORD *b2;
  uint *puVar5;
  uint *puVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  float fVar21;
  double dVar22;
  double dVar23;
  float fVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  float fVar32;
  double local_68;
  
  sVar1 = (short)viewheight;
  dVar30 = (plane->normal).X;
  dVar20 = (plane->normal).Y;
  if (dVar20 == 0.0 && dVar30 == 0.0) {
    iVar7 = OWallMost(mostbuf,plane->D * plane->negiC - ViewPos.Z,wallc);
    return iVar7;
  }
  if (((byte)MirrorFlags & 1) == 0) {
    dVar23 = (curline->v1->p).X;
    dVar27 = (curline->v1->p).Y;
    uVar18 = SUB84(dVar27,0);
    uVar19 = (undefined4)((ulong)dVar27 >> 0x20);
    dVar29 = dVar23;
    if (wallc->sx1 == 0) {
      fVar21 = (wallc->tleft).Y + (wallc->tleft).X;
      fVar24 = fVar21 - ((wallc->tright).X + (wallc->tright).Y);
      if (fVar24 != 0.0) {
        dVar22 = (double)fVar21 / (double)fVar24;
        dVar29 = ((curline->v2->p).X - dVar23) * dVar22 + dVar23;
        dVar27 = ((curline->v2->p).Y - dVar27) * dVar22 + dVar27;
      }
    }
    dVar28 = plane->D;
    uVar25 = SUB84(dVar28,0);
    uVar26 = (undefined4)((ulong)dVar28 >> 0x20);
    dVar22 = plane->negiC;
    dVar29 = ViewPos.Z - (dVar27 * dVar20 + dVar29 * dVar30 + dVar28) * dVar22;
    iVar7 = (int)wallc->sx2;
    dVar27 = dVar29;
    if (iVar7 <= wallc->sx1 + 1) goto LAB_0030c69f;
    pvVar3 = curline->v2;
  }
  else {
    dVar23 = (curline->v2->p).X;
    dVar27 = (curline->v2->p).Y;
    uVar18 = SUB84(dVar27,0);
    uVar19 = (undefined4)((ulong)dVar27 >> 0x20);
    dVar29 = dVar23;
    if (wallc->sx1 == 0) {
      fVar21 = (wallc->tleft).Y + (wallc->tleft).X;
      fVar24 = fVar21 - ((wallc->tright).X + (wallc->tright).Y);
      if (fVar24 != 0.0) {
        dVar22 = (double)fVar21 / (double)fVar24;
        dVar29 = ((curline->v1->p).X - dVar23) * dVar22 + dVar23;
        dVar27 = ((curline->v1->p).Y - dVar27) * dVar22 + dVar27;
      }
    }
    dVar28 = plane->D;
    uVar25 = SUB84(dVar28,0);
    uVar26 = (undefined4)((ulong)dVar28 >> 0x20);
    dVar22 = plane->negiC;
    dVar29 = ViewPos.Z - (dVar27 * dVar20 + dVar29 * dVar30 + dVar28) * dVar22;
    iVar7 = (int)wallc->sx2;
    dVar27 = dVar29;
    if (iVar7 <= wallc->sx1 + 1) goto LAB_0030c69f;
    pvVar3 = curline->v1;
  }
  dVar29 = (pvVar3->p).X;
  dVar28 = (pvVar3->p).Y;
  if (viewwidth == iVar7) {
    fVar21 = (wallc->tright).X;
    fVar24 = (wallc->tright).Y;
    fVar32 = ((wallc->tleft).X - ((wallc->tleft).Y + fVar21)) + fVar24;
    if (fVar32 != 0.0) {
      dVar31 = (double)(fVar24 - fVar21) / (double)fVar32;
      dVar29 = dVar29 + (dVar23 - dVar29) * dVar31;
      dVar28 = dVar28 + ((double)CONCAT44(uVar19,uVar18) - dVar28) * dVar31;
    }
  }
  dVar29 = ViewPos.Z -
           (dVar28 * dVar20 + (double)CONCAT44(uVar26,uVar25) + dVar29 * dVar30) * dVar22;
LAB_0030c69f:
  dVar30 = (double)wallc->sz1;
  dVar20 = globaluclip * dVar30;
  local_68 = (double)wallc->sz2;
  dVar22 = globaldclip * dVar30;
  dVar23 = globaldclip * local_68;
  iVar4 = (uint)(dVar27 < dVar20) + (uint)(dVar29 < globaluclip * local_68) * 2;
  iVar15 = (uint)(dVar23 < dVar29) * 8 + (uint)(dVar22 < dVar27) * 4;
  iVar16 = (int)wallc->sx1;
  iVar7 = (int)wallc->sx2;
  if (iVar4 == 3) {
    memset(mostbuf + iVar16,0,(long)(iVar7 - iVar16) * 2);
  }
  else if (iVar15 == 0xc) {
    if (wallc->sx2 != wallc->sx1) {
      uVar11 = 0;
      do {
        mostbuf[(long)iVar16 + uVar11] = sVar1;
        uVar11 = uVar11 + 1;
      } while ((uint)(iVar7 - iVar16) != uVar11);
    }
  }
  else {
    uVar18 = SUB84(dVar27,0);
    uVar19 = (undefined4)((ulong)dVar27 >> 0x20);
    dVar28 = dVar29;
    iVar17 = iVar16;
    if (iVar4 != 0) {
      dVar28 = (dVar27 - dVar20) / ((dVar27 - (dVar20 + dVar29)) + globaluclip * local_68);
      dVar20 = (double)(wallc->sz2 - wallc->sz1) * dVar28 + dVar30;
      iVar8 = SUB84(((double)(iVar7 - iVar16) * local_68 * dVar28) / dVar20 + 6755399441055744.0,0);
      dVar28 = (dVar29 - dVar27) * dVar28 + dVar27;
      iVar2 = iVar8 + iVar16;
      if (iVar4 == 2) {
        iVar16 = iVar2;
        if (iVar8 < 0) {
          dVar28 = dVar29;
          iVar16 = iVar7;
          dVar20 = local_68;
        }
        local_68 = dVar20;
        memset(mostbuf + iVar2,0,(long)(iVar7 - iVar2) * 2);
        iVar7 = iVar16;
      }
      else {
        dVar31 = dVar27;
        if (iVar2 <= iVar7) {
          dVar31 = dVar28;
          iVar17 = iVar2;
          dVar30 = dVar20;
        }
        memset(mostbuf + iVar16,0,(long)iVar8 * 2);
        uVar18 = SUB84(dVar31,0);
        uVar19 = (undefined4)((ulong)dVar31 >> 0x20);
        dVar28 = dVar29;
      }
    }
    sVar1 = (short)viewheight;
    dVar20 = (double)CONCAT44(uVar19,uVar18);
    if (iVar15 != 0) {
      dVar22 = (dVar27 - dVar22) / ((dVar23 + dVar27) - (dVar22 + dVar29));
      dVar23 = (double)(wallc->sz2 - wallc->sz1) * dVar22 + (double)wallc->sz1;
      iVar8 = (int)wallc->sx1;
      iVar2 = (int)wallc->sx2;
      uVar14 = SUB84(((double)(iVar2 - iVar8) * (double)wallc->sz2 * dVar22) / dVar23 +
                     6755399441055744.0,0);
      dVar27 = (dVar29 - dVar27) * dVar22 + dVar27;
      iVar16 = uVar14 + iVar8;
      if (iVar15 == 8) {
        if (-1 < (int)uVar14) {
          dVar28 = dVar27;
          local_68 = dVar23;
          iVar7 = iVar16;
        }
        if (iVar2 - iVar16 != 0 && iVar16 <= iVar2) {
          uVar11 = 0;
          do {
            mostbuf[(long)iVar16 + uVar11] = sVar1;
            uVar11 = uVar11 + 1;
          } while ((uint)(iVar2 - iVar16) != uVar11);
        }
      }
      else {
        if (iVar16 <= iVar2) {
          dVar20 = dVar27;
          dVar30 = dVar23;
          iVar17 = iVar16;
        }
        if (0 < (int)uVar14) {
          uVar11 = 0;
          do {
            mostbuf[(long)iVar8 + uVar11] = sVar1;
            uVar11 = uVar11 + 1;
          } while ((uVar14 & 0x7fffffff) != uVar11);
        }
      }
    }
    dVar30 = (dVar20 * InvZtoScale) / dVar30;
    uVar14 = iVar7 - iVar17;
    if (uVar14 != 0) {
      if (uVar14 != 0) {
        puVar5 = (uint *)(mostbuf + iVar17);
        uVar9 = SUB84(dVar30 + 103079215104.0 + CenterY,0) + 0x8000;
        iVar7 = SUB84(((InvZtoScale * dVar28) / local_68 - dVar30) / (double)(int)uVar14 +
                      103079215104.0,0);
        if (((ulong)puVar5 & 2) != 0) {
          *(short *)puVar5 = (short)(uVar9 >> 0x10);
          puVar5 = (uint *)((long)puVar5 + 2);
          uVar14 = uVar14 - 1;
          uVar9 = uVar9 + iVar7;
        }
        if (1 < uVar14) {
          uVar13 = uVar14 >> 1;
          puVar6 = puVar5;
          do {
            uVar12 = uVar9 + iVar7;
            uVar10 = uVar9 >> 0x10;
            puVar5 = puVar6 + 1;
            uVar9 = uVar12 + iVar7;
            *puVar6 = uVar10 | uVar12 & 0xffff0000;
            uVar13 = uVar13 - 1;
            puVar6 = puVar5;
          } while (uVar13 != 0);
        }
        if ((uVar14 & 1) != 0) {
          *(short *)puVar5 = (short)(uVar9 >> 0x10);
        }
      }
    }
    else {
      mostbuf[iVar17] = SUB82(dVar30 + 6755399441055744.0 + CenterY,0);
    }
  }
  return iVar4 + iVar15;
}

Assistant:

int WallMost (short *mostbuf, const secplane_t &plane, const FWallCoords *wallc)
{
	if (!plane.isSlope())
	{
		return OWallMost(mostbuf, plane.Zat0() - ViewPos.Z, wallc);
	}

	double x, y, den, z1, z2, oz1, oz2;
	double s1, s2, s3, s4;
	int bad, ix1, ix2;
	double iy1, iy2;

	// Get Z coordinates at both ends of the line
	if (MirrorFlags & RF_XFLIP)
	{
		x = curline->v2->fX();
		y = curline->v2->fY();
		if (wallc->sx1 == 0 && 0 != (den = wallc->tleft.X - wallc->tright.X + wallc->tleft.Y - wallc->tright.Y))
		{
			double frac = (wallc->tleft.Y + wallc->tleft.X) / den;
			x -= frac * (x - curline->v1->fX());
			y -= frac * (y - curline->v1->fY());
		}
		z1 = ViewPos.Z - plane.ZatPoint(x, y);

		if (wallc->sx2 > wallc->sx1 + 1)
		{
			x = curline->v1->fX();
			y = curline->v1->fY();
			if (wallc->sx2 == viewwidth && 0 != (den = wallc->tleft.X - wallc->tright.X - wallc->tleft.Y + wallc->tright.Y))
			{
				double frac = (wallc->tright.Y - wallc->tright.X) / den;
				x += frac * (curline->v2->fX() - x);
				y += frac * (curline->v2->fY() - y);
			}
			z2 = ViewPos.Z - plane.ZatPoint(x, y);
		}
		else
		{
			z2 = z1;
		}
	}
	else
	{
		x = curline->v1->fX();
		y = curline->v1->fY();
		if (wallc->sx1 == 0 && 0 != (den = wallc->tleft.X - wallc->tright.X + wallc->tleft.Y - wallc->tright.Y))
		{
			double frac = (wallc->tleft.Y + wallc->tleft.X) / den;
			x += frac * (curline->v2->fX() - x);
			y += frac * (curline->v2->fY() - y);
		}
		z1 = ViewPos.Z - plane.ZatPoint(x, y);

		if (wallc->sx2 > wallc->sx1 + 1)
		{
			x = curline->v2->fX();
			y = curline->v2->fY();
			if (wallc->sx2 == viewwidth && 0 != (den = wallc->tleft.X - wallc->tright.X - wallc->tleft.Y + wallc->tright.Y))
			{
				double frac = (wallc->tright.Y - wallc->tright.X) / den;
				x -= frac * (x - curline->v1->fX());
				y -= frac * (y - curline->v1->fY());
			}
			z2 = ViewPos.Z - plane.ZatPoint(x, y);
		}
		else
		{
			z2 = z1;
		}
	}

	s1 = globaluclip * wallc->sz1; s2 = globaluclip * wallc->sz2;
	s3 = globaldclip * wallc->sz1; s4 = globaldclip * wallc->sz2;
	bad = (z1<s1)+((z2<s2)<<1)+((z1>s3)<<2)+((z2>s4)<<3);

	ix1 = wallc->sx1; ix2 = wallc->sx2;
	iy1 = wallc->sz1; iy2 = wallc->sz2;
	oz1 = z1; oz2 = z2;

	if ((bad&3) == 3)
	{ // The entire line is above the screen
		memset (&mostbuf[ix1], 0, (ix2-ix1)*sizeof(mostbuf[0]));
		return bad;
	}

	if ((bad&12) == 12)
	{ // The entire line is below the screen
		clearbufshort (&mostbuf[ix1], ix2-ix1, viewheight);
		return bad;

	}

	if (bad&3)
	{ // The line intersects the top of the screen
			//inty = intz / (globaluclip>>16)
		double t = (oz1-s1) / (s2-s1+oz1-oz2);
		double inty = wallc->sz1 + t * (wallc->sz2-wallc->sz1);
		double intz = oz1 + t * (oz2-oz1);
		int xcross = wallc->sx1 + xs_RoundToInt((t * wallc->sz2 * (wallc->sx2-wallc->sx1)) / inty);

		//t = divscale30((x1<<4)-xcross*yb1[w],xcross*(yb2[w]-yb1[w])-((x2-x1)<<4));
		//inty = yb1[w] + mulscale30(yb2[w]-yb1[w],t);
		//intz = z1 + mulscale30(z2-z1,t);

		if ((bad&3) == 2)
		{ // The right side of the line is above the screen
			if (wallc->sx1 <= xcross) { z2 = intz; iy2 = inty; ix2 = xcross; }
			memset (&mostbuf[xcross], 0, (wallc->sx2-xcross)*sizeof(mostbuf[0]));
		}
		else
		{ // The left side of the line is above the screen
			if (xcross <= wallc->sx2) { z1 = intz; iy1 = inty; ix1 = xcross; }
			memset (&mostbuf[wallc->sx1], 0, (xcross-wallc->sx1)*sizeof(mostbuf[0]));
		}
	}

	if (bad&12)
	{ // The line intersects the bottom of the screen
			//inty = intz / (globaldclip>>16)
		double t = (oz1-s3) / (s4-s3+oz1-oz2);
		double inty = wallc->sz1 + t * (wallc->sz2-wallc->sz1);
		double intz = oz1 + t * (oz2-oz1);
		int xcross = wallc->sx1 + xs_RoundToInt((t * wallc->sz2 * (wallc->sx2-wallc->sx1)) / inty);

		//t = divscale30((x1<<4)-xcross*yb1[w],xcross*(yb2[w]-yb1[w])-((x2-x1)<<4));
		//inty = yb1[w] + mulscale30(yb2[w]-yb1[w],t);
		//intz = z1 + mulscale30(z2-z1,t);

		if ((bad&12) == 8)
		{ // The right side of the line is below the screen
			if (wallc->sx1 <= xcross) { z2 = intz; iy2 = inty; ix2 = xcross; }
			if (wallc->sx2 > xcross) clearbufshort (&mostbuf[xcross], wallc->sx2-xcross, viewheight);
		}
		else
		{ // The left side of the line is below the screen
			if (xcross <= wallc->sx2) { z1 = intz; iy1 = inty; ix1 = xcross; }
			if (xcross > wallc->sx1) clearbufshort (&mostbuf[wallc->sx1], xcross-wallc->sx1, viewheight);
		}
	}

	y = z1 * InvZtoScale / iy1;
	if (ix2 == ix1)
	{
		mostbuf[ix1] = (short)xs_RoundToInt(y + CenterY);
	}
	else
	{
		fixed_t yinc = FLOAT2FIXED(((z2 * InvZtoScale / iy2) - y) / (ix2-ix1));
		qinterpolatedown16short (&mostbuf[ix1], ix2-ix1, FLOAT2FIXED(y + CenterY) + FRACUNIT/2, yinc);
	}

	return bad;
}